

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_filtered_zigzag_persistence.cpp
# Opt level: O0

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* get_boundaries(void)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<int> __l_06;
  initializer_list<int> __l_07;
  initializer_list<int> __l_08;
  initializer_list<int> __l_09;
  initializer_list<int> __l_10;
  initializer_list<int> __l_11;
  initializer_list<int> __l_12;
  initializer_list<int> __l_13;
  initializer_list<int> __l_14;
  initializer_list<int> __l_15;
  initializer_list<int> __l_16;
  initializer_list<int> __l_17;
  initializer_list<int> __l_18;
  initializer_list<int> __l_19;
  initializer_list<int> __l_20;
  initializer_list<int> __l_21;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_22;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_RDI;
  vector<int,_std::allocator<int>_> *local_748;
  allocator<std::vector<int,_std::allocator<int>_>_> local_5a7;
  undefined1 local_5a6;
  allocator<int> local_5a5;
  int local_5a4;
  iterator local_5a0;
  size_type local_598;
  allocator<int> local_589;
  int local_588 [4];
  iterator local_578;
  size_type local_570;
  allocator<int> local_565;
  int local_564;
  iterator local_560;
  size_type local_558;
  allocator<int> local_54d;
  int local_54c;
  iterator local_548;
  size_type local_540;
  allocator<int> local_535;
  int local_534;
  iterator local_530;
  size_type local_528;
  allocator<int> local_51d;
  int local_51c [3];
  iterator local_510;
  size_type local_508;
  allocator<int> local_4fd;
  int local_4fc [3];
  iterator local_4f0;
  size_type local_4e8;
  allocator<int> local_4dd;
  int local_4dc [3];
  iterator local_4d0;
  size_type local_4c8;
  allocator<int> local_4b9;
  int local_4b8 [2];
  iterator local_4b0;
  size_type local_4a8;
  allocator<int> local_49d;
  int local_49c [3];
  iterator local_490;
  size_type local_488;
  allocator<int> local_479;
  int local_478 [2];
  iterator local_470;
  size_type local_468;
  allocator<int> local_45d;
  int local_45c [3];
  iterator local_450;
  size_type local_448;
  allocator<int> local_439;
  int local_438 [2];
  iterator local_430;
  size_type local_428;
  allocator<int> local_41d;
  int local_41c;
  iterator local_418;
  size_type local_410;
  allocator<int> local_405;
  int local_404;
  iterator local_400;
  size_type local_3f8;
  allocator<int> local_3ed;
  int local_3ec [3];
  iterator local_3e0;
  size_type local_3d8;
  allocator<int> local_3c9;
  int local_3c8 [2];
  iterator local_3c0;
  size_type local_3b8;
  allocator<int> local_3a9;
  int local_3a8 [2];
  iterator local_3a0;
  size_type local_398;
  allocator<int> local_38d;
  int local_38c [3];
  iterator local_380;
  size_type local_378;
  allocator<int> local_369;
  int local_368 [2];
  iterator local_360;
  size_type local_358;
  allocator<int> local_349;
  int local_348 [2];
  iterator local_340;
  size_type local_338;
  allocator<int> local_329;
  int local_328 [2];
  iterator local_320;
  size_type local_318;
  allocator<int> local_2f9;
  int local_2f8 [2];
  iterator local_2f0;
  size_type local_2e8;
  vector<int,_std::allocator<int>_> *local_2e0;
  vector<int,_std::allocator<int>_> local_2d8;
  vector<int,_std::allocator<int>_> local_2c0;
  vector<int,_std::allocator<int>_> local_2a8;
  vector<int,_std::allocator<int>_> local_290;
  vector<int,_std::allocator<int>_> local_278;
  vector<int,_std::allocator<int>_> local_260;
  vector<int,_std::allocator<int>_> local_248;
  vector<int,_std::allocator<int>_> local_230;
  vector<int,_std::allocator<int>_> local_218;
  vector<int,_std::allocator<int>_> local_200;
  vector<int,_std::allocator<int>_> local_1e8;
  vector<int,_std::allocator<int>_> local_1d0;
  vector<int,_std::allocator<int>_> local_1b8;
  vector<int,_std::allocator<int>_> local_1a0;
  vector<int,_std::allocator<int>_> local_188;
  vector<int,_std::allocator<int>_> local_170;
  vector<int,_std::allocator<int>_> local_158;
  vector<int,_std::allocator<int>_> local_140;
  vector<int,_std::allocator<int>_> local_128;
  vector<int,_std::allocator<int>_> local_110;
  vector<int,_std::allocator<int>_> local_f8;
  vector<int,_std::allocator<int>_> local_e0;
  vector<int,_std::allocator<int>_> local_c8;
  vector<int,_std::allocator<int>_> local_b0;
  vector<int,_std::allocator<int>_> local_98;
  vector<int,_std::allocator<int>_> local_80;
  vector<int,_std::allocator<int>_> local_68;
  vector<int,_std::allocator<int>_> local_50;
  vector<int,_std::allocator<int>_> local_38;
  vector<int,_std::allocator<int>_> local_20;
  
  local_5a6 = 1;
  local_2e0 = &local_2d8;
  local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(local_2e0);
  local_2e0 = &local_2c0;
  local_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(local_2e0);
  local_2e0 = &local_2a8;
  local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(local_2e0);
  local_2f8[0] = 0;
  local_2f8[1] = 1;
  local_2f0 = local_2f8;
  local_2e8 = 2;
  local_2e0 = &local_290;
  std::allocator<int>::allocator(&local_2f9);
  __l_21._M_len = local_2e8;
  __l_21._M_array = local_2f0;
  std::vector<int,_std::allocator<int>_>::vector(&local_290,__l_21,&local_2f9);
  local_328[0] = 0;
  local_328[1] = 2;
  local_320 = local_328;
  local_318 = 2;
  local_2e0 = &local_278;
  std::allocator<int>::allocator(&local_329);
  __l_20._M_len = local_318;
  __l_20._M_array = local_320;
  std::vector<int,_std::allocator<int>_>::vector(&local_278,__l_20,&local_329);
  local_2e0 = &local_260;
  local_260.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_260.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_260.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(local_2e0);
  local_348[0] = 1;
  local_348[1] = 2;
  local_340 = local_348;
  local_338 = 2;
  local_2e0 = &local_248;
  std::allocator<int>::allocator(&local_349);
  __l_19._M_len = local_338;
  __l_19._M_array = local_340;
  std::vector<int,_std::allocator<int>_>::vector(&local_248,__l_19,&local_349);
  local_2e0 = &local_230;
  local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(local_2e0);
  local_368[0] = 5;
  local_368[1] = 7;
  local_360 = local_368;
  local_358 = 2;
  local_2e0 = &local_218;
  std::allocator<int>::allocator(&local_369);
  __l_18._M_len = local_358;
  __l_18._M_array = local_360;
  std::vector<int,_std::allocator<int>_>::vector(&local_218,__l_18,&local_369);
  local_2e0 = &local_200;
  local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(local_2e0);
  local_38c[0] = 3;
  local_38c[1] = 4;
  local_38c[2] = 6;
  local_380 = local_38c;
  local_378 = 3;
  local_2e0 = &local_1e8;
  std::allocator<int>::allocator(&local_38d);
  __l_17._M_len = local_378;
  __l_17._M_array = local_380;
  std::vector<int,_std::allocator<int>_>::vector(&local_1e8,__l_17,&local_38d);
  local_3a8[0] = 7;
  local_3a8[1] = 9;
  local_3a0 = local_3a8;
  local_398 = 2;
  local_2e0 = &local_1d0;
  std::allocator<int>::allocator(&local_3a9);
  __l_16._M_len = local_398;
  __l_16._M_array = local_3a0;
  std::vector<int,_std::allocator<int>_>::vector(&local_1d0,__l_16,&local_3a9);
  local_3c8[0] = 5;
  local_3c8[1] = 9;
  local_3c0 = local_3c8;
  local_3b8 = 2;
  local_2e0 = &local_1b8;
  std::allocator<int>::allocator(&local_3c9);
  __l_15._M_len = local_3b8;
  __l_15._M_array = local_3c0;
  std::vector<int,_std::allocator<int>_>::vector(&local_1b8,__l_15,&local_3c9);
  local_3ec[0] = 8;
  local_3ec[1] = 0xb;
  local_3ec[2] = 0xc;
  local_3e0 = local_3ec;
  local_3d8 = 3;
  local_2e0 = &local_1a0;
  std::allocator<int>::allocator(&local_3ed);
  __l_14._M_len = local_3d8;
  __l_14._M_array = local_3e0;
  std::vector<int,_std::allocator<int>_>::vector(&local_1a0,__l_14,&local_3ed);
  local_404 = 10;
  local_400 = &local_404;
  local_3f8 = 1;
  local_2e0 = &local_188;
  std::allocator<int>::allocator(&local_405);
  __l_13._M_len = local_3f8;
  __l_13._M_array = local_400;
  std::vector<int,_std::allocator<int>_>::vector(&local_188,__l_13,&local_405);
  local_41c = 0xd;
  local_418 = &local_41c;
  local_410 = 1;
  local_2e0 = &local_170;
  std::allocator<int>::allocator(&local_41d);
  __l_12._M_len = local_410;
  __l_12._M_array = local_418;
  std::vector<int,_std::allocator<int>_>::vector(&local_170,__l_12,&local_41d);
  local_438[0] = 1;
  local_438[1] = 7;
  local_430 = local_438;
  local_428 = 2;
  local_2e0 = &local_158;
  std::allocator<int>::allocator(&local_439);
  __l_11._M_len = local_428;
  __l_11._M_array = local_430;
  std::vector<int,_std::allocator<int>_>::vector(&local_158,__l_11,&local_439);
  local_45c[0] = 3;
  local_45c[1] = 4;
  local_45c[2] = 6;
  local_450 = local_45c;
  local_448 = 3;
  local_2e0 = &local_140;
  std::allocator<int>::allocator(&local_45d);
  __l_10._M_len = local_448;
  __l_10._M_array = local_450;
  std::vector<int,_std::allocator<int>_>::vector(&local_140,__l_10,&local_45d);
  local_478[0] = 2;
  local_478[1] = 7;
  local_470 = local_478;
  local_468 = 2;
  local_2e0 = &local_128;
  std::allocator<int>::allocator(&local_479);
  __l_09._M_len = local_468;
  __l_09._M_array = local_470;
  std::vector<int,_std::allocator<int>_>::vector(&local_128,__l_09,&local_479);
  local_49c[0] = 8;
  local_49c[1] = 0xb;
  local_49c[2] = 0xc;
  local_490 = local_49c;
  local_488 = 3;
  local_2e0 = &local_110;
  std::allocator<int>::allocator(&local_49d);
  __l_08._M_len = local_488;
  __l_08._M_array = local_490;
  std::vector<int,_std::allocator<int>_>::vector(&local_110,__l_08,&local_49d);
  local_4b8[0] = 0;
  local_4b8[1] = 7;
  local_4b0 = local_4b8;
  local_4a8 = 2;
  local_2e0 = &local_f8;
  std::allocator<int>::allocator(&local_4b9);
  __l_07._M_len = local_4a8;
  __l_07._M_array = local_4b0;
  std::vector<int,_std::allocator<int>_>::vector(&local_f8,__l_07,&local_4b9);
  local_4dc[0] = 4;
  local_4dc[1] = 0x12;
  local_4dc[2] = 0x14;
  local_4d0 = local_4dc;
  local_4c8 = 3;
  local_2e0 = &local_e0;
  std::allocator<int>::allocator(&local_4dd);
  __l_06._M_len = local_4c8;
  __l_06._M_array = local_4d0;
  std::vector<int,_std::allocator<int>_>::vector(&local_e0,__l_06,&local_4dd);
  local_4fc[0] = 6;
  local_4fc[1] = 0x10;
  local_4fc[2] = 0x12;
  local_4f0 = local_4fc;
  local_4e8 = 3;
  local_2e0 = &local_c8;
  std::allocator<int>::allocator(&local_4fd);
  __l_05._M_len = local_4e8;
  __l_05._M_array = local_4f0;
  std::vector<int,_std::allocator<int>_>::vector(&local_c8,__l_05,&local_4fd);
  local_51c[0] = 3;
  local_51c[1] = 0x10;
  local_51c[2] = 0x14;
  local_510 = local_51c;
  local_508 = 3;
  local_2e0 = &local_b0;
  std::allocator<int>::allocator(&local_51d);
  __l_04._M_len = local_508;
  __l_04._M_array = local_510;
  std::vector<int,_std::allocator<int>_>::vector(&local_b0,__l_04,&local_51d);
  local_534 = 0x13;
  local_530 = &local_534;
  local_528 = 1;
  local_2e0 = &local_98;
  std::allocator<int>::allocator(&local_535);
  __l_03._M_len = local_528;
  __l_03._M_array = local_530;
  std::vector<int,_std::allocator<int>_>::vector(&local_98,__l_03,&local_535);
  local_54c = 8;
  local_548 = &local_54c;
  local_540 = 1;
  local_2e0 = &local_80;
  std::allocator<int>::allocator(&local_54d);
  __l_02._M_len = local_540;
  __l_02._M_array = local_548;
  std::vector<int,_std::allocator<int>_>::vector(&local_80,__l_02,&local_54d);
  local_564 = 0xc;
  local_560 = &local_564;
  local_558 = 1;
  local_2e0 = &local_68;
  std::allocator<int>::allocator(&local_565);
  __l_01._M_len = local_558;
  __l_01._M_array = local_560;
  std::vector<int,_std::allocator<int>_>::vector(&local_68,__l_01,&local_565);
  local_588[0] = 0x11;
  local_588[1] = 0x15;
  local_588[2] = 0x16;
  local_588[3] = 0x17;
  local_578 = local_588;
  local_570 = 4;
  local_2e0 = &local_50;
  std::allocator<int>::allocator(&local_589);
  __l_00._M_len = local_570;
  __l_00._M_array = local_578;
  std::vector<int,_std::allocator<int>_>::vector(&local_50,__l_00,&local_589);
  local_5a4 = 0x1b;
  local_5a0 = &local_5a4;
  local_598 = 1;
  local_2e0 = &local_38;
  std::allocator<int>::allocator(&local_5a5);
  __l._M_len = local_598;
  __l._M_array = local_5a0;
  std::vector<int,_std::allocator<int>_>::vector(&local_38,__l,&local_5a5);
  local_5a6 = 0;
  local_20.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_2d8;
  local_20.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x1d;
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(&local_5a7);
  __l_22._M_len =
       (size_type)
       local_20.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  __l_22._M_array =
       (iterator)
       local_20.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(in_RDI,__l_22,&local_5a7);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator(&local_5a7);
  local_748 = &local_20;
  do {
    local_748 = local_748 + -1;
    std::vector<int,_std::allocator<int>_>::~vector(local_748);
  } while (local_748 != &local_2d8);
  std::allocator<int>::~allocator(&local_5a5);
  std::allocator<int>::~allocator(&local_589);
  std::allocator<int>::~allocator(&local_565);
  std::allocator<int>::~allocator(&local_54d);
  std::allocator<int>::~allocator(&local_535);
  std::allocator<int>::~allocator(&local_51d);
  std::allocator<int>::~allocator(&local_4fd);
  std::allocator<int>::~allocator(&local_4dd);
  std::allocator<int>::~allocator(&local_4b9);
  std::allocator<int>::~allocator(&local_49d);
  std::allocator<int>::~allocator(&local_479);
  std::allocator<int>::~allocator(&local_45d);
  std::allocator<int>::~allocator(&local_439);
  std::allocator<int>::~allocator(&local_41d);
  std::allocator<int>::~allocator(&local_405);
  std::allocator<int>::~allocator(&local_3ed);
  std::allocator<int>::~allocator(&local_3c9);
  std::allocator<int>::~allocator(&local_3a9);
  std::allocator<int>::~allocator(&local_38d);
  std::allocator<int>::~allocator(&local_369);
  std::allocator<int>::~allocator(&local_349);
  std::allocator<int>::~allocator(&local_329);
  std::allocator<int>::~allocator(&local_2f9);
  return in_RDI;
}

Assistant:

std::vector<std::vector<int> > get_boundaries() {
  return {{},
          {},
          {},
          {0, 1},
          {0, 2},
          {},
          {1, 2},
          {},
          {5, 7},
          {},
          {3, 4, 6},
          {7, 9},
          {5, 9},
          {8, 11, 12},
          {10},                         // remove
          {13},                         // remove
          {1, 7},
          {3, 4, 6},
          {2, 7},
          {8, 11, 12},
          {0, 7},
          {4, 18, 20},
          {6, 16, 18},
          {3, 16, 20},
          {19},                         // remove
          {8},                          // remove
          {12},                         // remove
          {17, 21, 22, 23},
          {27}};                        // remove
}